

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,WitnessV0KeyHash *id)

{
  SigningProvider *pSVar1;
  int iVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string in_stack_fffffffffffffec8;
  UniValue in_stack_fffffffffffffee8;
  string local_b0 [39];
  CPubKey pubkey;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string((string *)&local_48);
  pubkey.vch[0] = 0xff;
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    ToKeyID((CKeyID *)&stack0xfffffffffffffed8,id);
    iVar2 = (*pSVar1->_vptr_SigningProvider[4])(pSVar1,&stack0xfffffffffffffed8,&pubkey);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"pubkey",(allocator<char> *)&stack0xfffffffffffffed7);
      if ((pubkey.vch[0] & 0xfe) == 2) {
        sVar3 = 0x21;
      }
      else if ((byte)(pubkey.vch[0] - 4) < 4) {
        sVar3 = *(size_t *)(&DAT_006d3710 + (ulong)(byte)(pubkey.vch[0] - 4) * 8);
      }
      else {
        sVar3 = 0;
      }
      s.m_size = sVar3;
      s.m_data = pubkey.vch;
      HexStr_abi_cxx11_((string *)&stack0xfffffffffffffed8,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)&stack0xfffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed8);
      UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffec8,in_stack_fffffffffffffee8);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffffef8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
      std::__cxx11::string::~string(local_b0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0KeyHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        CPubKey pubkey;
        if (provider && provider->GetPubKey(ToKeyID(id), pubkey)) {
            obj.pushKV("pubkey", HexStr(pubkey));
        }
        return obj;
    }